

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoquad.h
# Opt level: O2

void pzgeom::TPZGeoQuad::GradX<Fad<double>>
               (TPZFMatrix<double> *nodes,TPZVec<Fad<double>_> *loc,TPZFMatrix<Fad<double>_> *gradx)

{
  int iVar1;
  Fad<double> *pFVar2;
  int j;
  ulong row;
  ulong uVar3;
  ulong col;
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> local_2d0;
  TPZFNMatrix<6,_Fad<double>_> dphi;
  TPZFNMatrix<3,_Fad<double>_> phi;
  
  uVar3 = (nodes->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  iVar1 = (int)uVar3;
  (*(gradx->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
    [0xd])(gradx,(long)iVar1,2);
  (*(gradx->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
    [0xf])(gradx);
  TPZFNMatrix<3,_Fad<double>_>::TPZFNMatrix(&phi,4,1);
  TPZFNMatrix<6,_Fad<double>_>::TPZFNMatrix(&dphi,2,4);
  pztopology::TPZQuadrilateral::TShape<Fad<double>>
            (loc,&phi.super_TPZFMatrix<Fad<double>_>,&dphi.super_TPZFMatrix<Fad<double>_>);
  col = 0;
  uVar3 = uVar3 & 0xffffffff;
  if (iVar1 < 1) {
    uVar3 = col;
  }
  for (; col != 4; col = col + 1) {
    for (row = 0; uVar3 != row; row = row + 1) {
      (*(nodes->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x24]
      )(nodes,row,col);
      local_2d0.fadexpr_.right_ =
           TPZFMatrix<Fad<double>_>::operator()(&dphi.super_TPZFMatrix<Fad<double>_>,0,col);
      local_2d0.fadexpr_.left_.defaultVal = 0.0;
      pFVar2 = TPZFMatrix<Fad<double>_>::operator()(gradx,row,0);
      Fad<double>::operator+=(pFVar2,&local_2d0);
      (*(nodes->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x24]
      )(nodes,row,col);
      local_2d0.fadexpr_.right_ =
           TPZFMatrix<Fad<double>_>::operator()(&dphi.super_TPZFMatrix<Fad<double>_>,1,col);
      local_2d0.fadexpr_.left_.defaultVal = 0.0;
      pFVar2 = TPZFMatrix<Fad<double>_>::operator()(gradx,row,1);
      Fad<double>::operator+=(pFVar2,&local_2d0);
    }
  }
  TPZFNMatrix<6,_Fad<double>_>::~TPZFNMatrix(&dphi);
  TPZFNMatrix<3,_Fad<double>_>::~TPZFNMatrix(&phi);
  return;
}

Assistant:

inline void TPZGeoQuad::GradX(const TPZFMatrix<REAL> &nodes,TPZVec<T> &loc, TPZFMatrix<T> &gradx){
        
        int space = nodes.Rows();
        int ncol = nodes.Cols();
        
        gradx.Resize(space,2);
        gradx.Zero();
        
#ifdef PZDEBUG
        if(/* nrow != 3 || */ ncol  != 4){
            std::cout << "Objects of incompatible lengths, gradient cannot be computed." << std::endl;
            std::cout << "nodes matrix must be spacex4." << std::endl;
            DebugStop();
        }
        
#endif
        TPZFNMatrix<3,T> phi(4,1);
        TPZFNMatrix<6,T> dphi(2,4);
        TShape(loc,phi,dphi);
        for(int i = 0; i < 4; i++)
        {
            for(int j = 0; j < space; j++)
            {
                gradx(j,0) += nodes.GetVal(j,i)*dphi(0,i);
                gradx(j,1) += nodes.GetVal(j,i)*dphi(1,i);
            }
        }
        
    }